

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)10,(moira::Mode)7,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  Ea<(moira::Mode)7,_(moira::Size)4> dst;
  Ea<(moira::Mode)7,_(moira::Size)4> local_44;
  
  *addr = *addr + 2;
  iVar3 = (*this->_vptr_Moira[5])();
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[5])(this);
  local_44.reg = op & 7;
  local_44.pc = *addr;
  *addr = local_44.pc + 2;
  local_44.ext1 = (*this->_vptr_Moira[5])(this);
  local_44.ext1 = local_44.ext1 & 0xffff;
  pcVar5 = "andi";
  if (str->upper != false) {
    pcVar5 = "ANDI";
  }
  cVar6 = *pcVar5;
  while (cVar6 != '\0') {
    pcVar5 = pcVar5 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar6;
    cVar6 = *pcVar5;
  }
  if (str->upper == false) {
    cVar6 = '.';
    lVar7 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar6;
      cVar6 = ".l"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  else {
    cVar6 = '.';
    lVar7 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar6;
      cVar6 = ".L"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  iVar1 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar1) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = '#';
  StrWriter::operator<<(str,(UInt)(iVar3 << 0x10 | uVar4 & 0xffff));
  cVar6 = ',';
  lVar7 = 0;
  do {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = cVar6;
    cVar6 = "), "[lVar7 + 2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  StrWriter::operator<<(str,&local_44);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imu      ( dasmRead<S>(addr)          );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}